

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

void __thiscall QAccessibleToolButton::doAction(QAccessibleToolButton *this,QString *actionName)

{
  bool bVar1;
  ToolButtonPopupMode TVar2;
  QWidget *pQVar3;
  QString *pQVar4;
  QAbstractButton *this_00;
  QToolButton *pQVar5;
  
  pQVar3 = QAccessibleWidget::widget((QAccessibleWidget *)this);
  if ((pQVar3->data->widget_attributes & 1) == 0) {
    pQVar4 = (QString *)QAccessibleActionInterface::pressAction();
    bVar1 = ::comparesEqual(actionName,pQVar4);
    if (bVar1) {
      this_00 = QAccessibleButton::button(&this->super_QAccessibleButton);
      QAbstractButton::click(this_00);
      return;
    }
    pQVar4 = (QString *)QAccessibleActionInterface::showMenuAction();
    bVar1 = ::comparesEqual(actionName,pQVar4);
    if (!bVar1) {
      QAccessibleButton::doAction(&this->super_QAccessibleButton,actionName);
      return;
    }
    pQVar5 = toolButton(this);
    TVar2 = QToolButton::popupMode(pQVar5);
    if (TVar2 != InstantPopup) {
      pQVar5 = toolButton(this);
      QAbstractButton::setDown(&pQVar5->super_QAbstractButton,true);
      pQVar5 = toolButton(this);
      QToolButton::showMenu(pQVar5);
      return;
    }
  }
  return;
}

Assistant:

void QAccessibleToolButton::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;

    if (actionName == pressAction()) {
        button()->click();
    } else if (actionName == showMenuAction()) {
#if QT_CONFIG(menu)
        if (toolButton()->popupMode() != QToolButton::InstantPopup) {
            toolButton()->setDown(true);
            toolButton()->showMenu();
        }
#endif
    } else {
        QAccessibleButton::doAction(actionName);
    }

}